

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall test_solvers_4x5::test_method(test_solvers_4x5 *this)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  matrix;
  size_t expected_assignment [4];
  allocator_type local_79;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  local_60;
  unsigned_long local_38 [5];
  
  local_38[2] = 3;
  local_38[3] = 4;
  local_38[0] = 0;
  local_38[1] = 2;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&local_60,4,5);
  memcpy(local_60.data_.data_,&DAT_0011fa00,0xa0);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,local_38,local_38 + 4,
             &local_79);
  assert_solvers_result<double,std::less<double>>
            (&local_60,31.0,&local_78,(less<double> *)&local_79);
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.data_.size_ != 0) {
    operator_delete(local_60.data_.data_);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_4x5)
{
  const double costs[] = {10, 19, 8, 15, 0,
                          10, 18, 7, 17, 0,
                          13, 16, 9, 14, 0,
                          12, 19, 8, 18, 0};
  const std::size_t expected_assignment[] = {0, 2, 3, 4};
  assert_solvers_result(make_matrix(costs, 4, 5), 31.0, make_vector(expected_assignment, 4));
}